

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall
CVmObjByteArray::move_bytes
          (CVmObjByteArray *this,unsigned_long dst_idx,unsigned_long src_idx,unsigned_long cnt)

{
  uchar *puVar1;
  size_t *psVar2;
  uchar *puVar3;
  CVmObjByteArray *this_00;
  CVmObjByteArray *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  size_t move_len_1;
  size_t move_len;
  uchar *dstp;
  uchar *srcp;
  size_t dst_avail;
  size_t src_avail;
  CVmObjByteArray *local_50;
  CVmObjByteArray *local_48;
  size_t *in_stack_ffffffffffffffc0;
  unsigned_long in_stack_ffffffffffffffc8;
  CVmObjByteArray *in_stack_ffffffffffffffd0;
  CVmObjByteArray *local_28;
  CVmObjByteArray *local_20;
  
  local_20 = in_RCX;
  if (in_RSI < in_RDX) {
    puVar1 = get_ele_ptr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0);
    psVar2 = (size_t *)
             get_ele_ptr(in_stack_ffffffffffffffd0,(unsigned_long)puVar1,in_stack_ffffffffffffffc0);
    while (local_20 != (CVmObjByteArray *)0x0) {
      local_48 = local_20;
      if (local_28 < local_20) {
        local_48 = local_28;
      }
      if (in_stack_ffffffffffffffd0 < local_48) {
        local_48 = in_stack_ffffffffffffffd0;
      }
      memmove(psVar2,puVar1,(size_t)local_48);
      puVar1 = puVar1 + (long)&local_48->super_CVmObject;
      psVar2 = (size_t *)((long)&(local_48->super_CVmObject)._vptr_CVmObject + (long)psVar2);
      local_20 = (CVmObjByteArray *)((long)local_20 - (long)local_48);
      local_28 = (CVmObjByteArray *)((long)local_28 - (long)local_48);
      in_stack_ffffffffffffffd0 =
           (CVmObjByteArray *)((long)in_stack_ffffffffffffffd0 - (long)local_48);
      if (local_20 == (CVmObjByteArray *)0x0) {
        return;
      }
      if (local_28 == (CVmObjByteArray *)0x0) {
        puVar1 = get_ele_ptr(in_stack_ffffffffffffffd0,(unsigned_long)puVar1,psVar2);
      }
      if (in_stack_ffffffffffffffd0 == (CVmObjByteArray *)0x0) {
        psVar2 = (size_t *)get_ele_ptr((CVmObjByteArray *)0x0,(unsigned_long)puVar1,psVar2);
      }
    }
  }
  else {
    puVar1 = get_ele_ptr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0);
    puVar1 = puVar1 + 1;
    puVar3 = get_ele_ptr(in_stack_ffffffffffffffd0,(unsigned_long)puVar1,in_stack_ffffffffffffffc0);
    psVar2 = (size_t *)(puVar3 + 1);
    local_28 = (CVmObjByteArray *)(0x8001 - (long)local_28);
    this_00 = (CVmObjByteArray *)(0x8001 - (long)in_stack_ffffffffffffffd0);
    while (local_20 != (CVmObjByteArray *)0x0) {
      local_50 = local_20;
      if (local_28 < local_20) {
        local_50 = local_28;
      }
      if (this_00 < local_50) {
        local_50 = this_00;
      }
      memmove((void *)((long)psVar2 - (long)local_50),puVar1 + -(long)local_50,(size_t)local_50);
      puVar1 = puVar1 + -(long)local_50;
      psVar2 = (size_t *)((long)psVar2 - (long)local_50);
      local_20 = (CVmObjByteArray *)((long)local_20 - (long)local_50);
      local_28 = (CVmObjByteArray *)((long)local_28 - (long)local_50);
      this_00 = (CVmObjByteArray *)((long)this_00 - (long)local_50);
      if (local_20 == (CVmObjByteArray *)0x0) {
        return;
      }
      if (local_28 == (CVmObjByteArray *)0x0) {
        puVar1 = get_ele_ptr(this_00,(unsigned_long)puVar1,psVar2);
        puVar1 = puVar1 + 1;
        local_28 = (CVmObjByteArray *)0x8001;
      }
      if (this_00 == (CVmObjByteArray *)0x0) {
        puVar3 = get_ele_ptr((CVmObjByteArray *)0x0,(unsigned_long)puVar1,psVar2);
        psVar2 = (size_t *)(puVar3 + 1);
        this_00 = (CVmObjByteArray *)(0x8001 - (long)this_00);
      }
    }
  }
  return;
}

Assistant:

void CVmObjByteArray::move_bytes(unsigned long dst_idx,
                                 unsigned long src_idx,
                                 unsigned long cnt)
{
    size_t src_avail;
    size_t dst_avail;
    unsigned char *srcp;
    unsigned char *dstp;

    /* 
     *   If the destination is before the source, we're moving bytes down,
     *   so we must start at the low end and work forwards through the
     *   array.  If the destination is after the source, we're moving bytes
     *   up, so we must start at the high end and work backwards through the
     *   array.  
     */
    if (dst_idx < src_idx)
    {

        /* 
         *   Moving bytes down in the array - start at the low end and work
         *   forwards through the array.  Get the starting pointers and
         *   available lengths.  
         */
        srcp = get_ele_ptr(src_idx, &src_avail);
        dstp = get_ele_ptr(dst_idx, &dst_avail);

        /* keep going until we've moved all of the bytes requested */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp, srcp, move_len);

            /* advance all of the counters by the move size */
            srcp += move_len;
            dstp += move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx += move_len;
            dst_idx += move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if the source chunk is at an end, get the next one */
            if (src_avail == 0)
                srcp = get_ele_ptr(src_idx, &src_avail);

            /* if the destination chunk is at an end, get the next one */
            if (dst_avail == 0)
                dstp = get_ele_ptr(dst_idx, &dst_avail);
        }
    }
    else
    {
        /* 
         *   We're to move bytes up in the array - start at the high end and
         *   work backwards through the array.  Advance each index to one
         *   past the last byte of its range.  
         */
        src_idx += cnt;
        dst_idx += cnt;

        /* get the chunk pointers */
        srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
        dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;

        /* 
         *   since we're working backwards, we actually want to know the
         *   number of bytes on the page *before* the current pointers, so
         *   subtract the available spaces from the size of the page to get
         *   the available space preceding each 
         */
        src_avail = 32*1024 - src_avail + 1;
        dst_avail = 32*1024 - dst_avail + 1;

        /* keep going until we've moved all of the requested bytes */
        while (cnt != 0)
        {
            size_t move_len;

            /* 
             *   figure the largest amount we can move - we can move the
             *   smallest of the remaining requested move size, the source
             *   chunk, and the destination chunk 
             */
            move_len = cnt;
            if (move_len > src_avail)
                move_len = src_avail;
            if (move_len > dst_avail)
                move_len = dst_avail;

            /* move the data */
            memmove(dstp - move_len, srcp - move_len, move_len);

            /* advance all of the counters by the move size */
            srcp -= move_len;
            dstp -= move_len;
            cnt -= move_len;
            src_avail -= move_len;
            dst_avail -= move_len;
            src_idx -= move_len;
            dst_idx -= move_len;

            /* stop if we're done */
            if (cnt == 0)
                break;

            /* if we've exhausted the source chunk, get the next one */
            if (src_avail == 0)
            {
                srcp = get_ele_ptr(src_idx - 1, &src_avail) + 1;
                src_avail = 32*1024 - src_avail + 1;
            }

            /* if we've exhausted the destination chunk, get the next one */
            if (dst_avail == 0)
            {
                dstp = get_ele_ptr(dst_idx - 1, &dst_avail) + 1;
                dst_avail = 32*1024 - dst_avail + 1;
            }
        }
    }
}